

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O3

double __thiscall units::detail::unit_data::pow(unit_data *this,double __x,double __y)

{
  unit_data uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint in_ESI;
  uint eflag;
  double extraout_XMM0_Qa;
  unit_data local_34;
  
  uVar1 = *this;
  uVar3 = (int)uVar1._0_1_ >> 4;
  iVar2 = uVar3 * in_ESI;
  if ((iVar2 == 0) || ((~(uint)uVar1 & 0x60000000) != 0 || (in_ESI & 1) != 0)) {
    if ((in_ESI & 1) != 0) {
      uVar3 = (uint)uVar1 >> 0x1d & 1;
      eflag = (uint)uVar1 >> 0x1e & 1;
      iVar4 = 0;
      goto LAB_003199f2;
    }
    iVar4 = 0;
  }
  else {
    iVar4 = 9;
    if (-1 < (int)(uVar3 | in_ESI)) {
      iVar4 = -9;
    }
    iVar4 = iVar4 * ((int)in_ESI >> 1);
  }
  if ((~(uint)uVar1 & 0x60000000) == 0) {
    eflag = 0;
  }
  else {
    eflag = (uint)uVar1 >> 0x1e & 1;
  }
  uVar3 = 0;
LAB_003199f2:
  unit_data(&local_34,(((int)uVar1 << 0x1c) >> 0x1c) * in_ESI,
            (((int)uVar1 << 0x15) >> 0x1d) * in_ESI,iVar4 + iVar2,
            (((int)uVar1 << 0x12) >> 0x1d) * in_ESI,(((int)uVar1 << 0xd) >> 0x1d) * in_ESI,
            (((int)uVar1 << 0xb) >> 0x1e) * in_ESI,((int)uVar1._0_2_ >> 0xe) * in_ESI,
            (((int)uVar1 << 6) >> 0x1e) * in_ESI,(((int)uVar1 << 4) >> 0x1e) * in_ESI,
            (((int)uVar1 << 8) >> 0x1d) * in_ESI,(uint)uVar1 >> 0x1c & 1,uVar3,eflag,
            (uint)uVar1 >> 0x1f);
  return extraout_XMM0_Qa;
}

Assistant:

constexpr unit_data pow(int power) const
        {  // the modifier is to handle a few weird operations that operate on
           // square_root Hz,
            return {
                meter_ * power,
                kilogram_ * power,
                (second_ * power) + rootHertzModifier(power),
                ampere_ * power,
                kelvin_ * power,
                mole_ * power,
                candela_ * power,
                currency_ * power,
                count_ * power,
                radians_ * power,
                per_unit_,
                (power % 2 == 0) ? 0U : i_flag_,
                (power % 2 == 0) ? ((i_flag_ && e_flag_) ? 0U : e_flag_) :
                                   e_flag_,
                equation_};
        }